

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::DetermineHasMacOSXRpathInstallNameDir(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  ImportInfo *pIVar6;
  cmValue cVar7;
  cmake *this_01;
  long lVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string install_name;
  undefined1 local_1d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  bVar2 = cmTarget::IsImported(this->Target);
  if (bVar2) {
    pIVar6 = GetImportInfo(this,config);
    if (pIVar6 == (ImportInfo *)0x0) {
      bVar3 = false;
      bVar10 = false;
    }
    else if ((pIVar6->NoSOName == false) &&
            (local_1a0._M_allocated_capacity = (pIVar6->SOName)._M_string_length,
            local_1a0._M_allocated_capacity != 0)) {
      local_1a0._8_8_ = (pIVar6->SOName)._M_dataplus._M_p;
      bVar3 = false;
      __str._M_str = "@rpath/";
      __str._M_len = 7;
      iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_1a0,0,7,__str);
      bVar10 = iVar4 == 0;
    }
    else {
      local_1a0._8_8_ = (pointer)0x0;
      local_190[0]._M_local_buf[0] = '\0';
      local_1a0._M_allocated_capacity = (size_type)local_190;
      cmSystemTools::GuessLibraryInstallName(&pIVar6->Location,(string *)&local_1a0);
      lVar8 = std::__cxx11::string::find(local_1a0._M_local_buf,0x7cecf3,0);
      bVar10 = lVar8 != -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_allocated_capacity != local_190) {
        operator_delete((void *)local_1a0._M_allocated_capacity,
                        CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                 local_190[0]._M_local_buf[0]) + 1);
      }
      bVar3 = false;
    }
    goto LAB_003d66c1;
  }
  TVar5 = cmTarget::GetType(this->Target);
  if (TVar5 != SHARED_LIBRARY) {
    return false;
  }
  local_1a0._M_allocated_capacity = (size_type)local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"INSTALL_NAME_DIR","");
  cVar7 = GetProperty(this,(string *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_allocated_capacity != local_190) {
    operator_delete((void *)local_1a0._M_allocated_capacity,
                    CONCAT71(local_190[0]._M_allocated_capacity._1_7_,local_190[0]._M_local_buf[0])
                    + 1);
  }
  bVar2 = MacOSXUseInstallNameDir(this);
  if (bVar2 && cVar7.Value != (string *)0x0) {
    iVar4 = std::__cxx11::string::compare((char *)cVar7.Value);
    bVar11 = iVar4 == 0;
    bVar1 = false;
    bVar3 = false;
    bVar10 = false;
    if ((!bVar2 || cVar7.Value == (string *)0x0) || bVar11) goto LAB_003d669d;
  }
  else {
    bVar11 = false;
LAB_003d669d:
    bVar1 = true;
    bVar10 = bVar11;
    if (bVar11) {
      bVar3 = false;
    }
    else {
      bVar3 = MacOSXRpathInstallNameDirDefault(this);
    }
  }
  if (!bVar1) {
    return false;
  }
LAB_003d66c1:
  if ((!bVar10) && (bVar3 == false)) {
    return false;
  }
  this_00 = this->Makefile;
  local_1a0._M_allocated_capacity = (size_type)local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG","");
  bVar2 = cmMakefile::IsSet(this_00,(string *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_allocated_capacity != local_190) {
    operator_delete((void *)local_1a0._M_allocated_capacity,
                    CONCAT71(local_190[0]._M_allocated_capacity._1_7_,local_190[0]._M_local_buf[0])
                    + 1);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0._M_local_buf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Attempting to use ",0x12);
    pcVar9 = "@rpath";
    if (bVar3 != false) {
      pcVar9 = "MACOSX_RPATH";
    }
    lVar8 = 6;
    if (bVar3 != false) {
      lVar8 = 0xc;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar9,lVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0," without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.",0x37)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"  This could be because you are using a Mac OS X version",0x38
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0," less than 10.5 or because CMake\'s platform configuration is"
               ,0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," corrupt.",9);
    this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    std::__cxx11::stringbuf::str();
    GetBacktrace((cmGeneratorTarget *)local_1d0);
    cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_1d0 + 0x10),
                        (cmListFileBacktrace *)local_1d0);
    if ((cmMakefile *)local_1d0._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0._M_local_buf);
    std::ios_base::~ios_base(local_130);
    return true;
  }
  return true;
}

Assistant:

bool cmGeneratorTarget::DetermineHasMacOSXRpathInstallNameDir(
  const std::string& config) const
{
  bool install_name_is_rpath = false;
  bool macosx_rpath = false;

  if (!this->IsImported()) {
    if (this->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return false;
    }
    cmValue install_name = this->GetProperty("INSTALL_NAME_DIR");
    bool use_install_name = this->MacOSXUseInstallNameDir();
    if (install_name && use_install_name && *install_name == "@rpath") {
      install_name_is_rpath = true;
    } else if (install_name && use_install_name) {
      return false;
    }
    if (!install_name_is_rpath) {
      macosx_rpath = this->MacOSXRpathInstallNameDirDefault();
    }
  } else {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (!info->NoSOName && !info->SOName.empty()) {
        if (cmHasLiteralPrefix(info->SOName, "@rpath/")) {
          install_name_is_rpath = true;
        }
      } else {
        std::string install_name;
        cmSystemTools::GuessLibraryInstallName(info->Location, install_name);
        if (install_name.find("@rpath") != std::string::npos) {
          install_name_is_rpath = true;
        }
      }
    }
  }

  if (!install_name_is_rpath && !macosx_rpath) {
    return false;
  }

  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    std::ostringstream w;
    w << "Attempting to use ";
    if (macosx_rpath) {
      w << "MACOSX_RPATH";
    } else {
      w << "@rpath";
    }
    w << " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.";
    w << "  This could be because you are using a Mac OS X version";
    w << " less than 10.5 or because CMake's platform configuration is";
    w << " corrupt.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return true;
}